

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zip_read_data_deflate(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  wchar_t wVar1;
  void *pvVar2;
  size_t local_68;
  size_t dsize;
  size_t buff_remaining;
  uint8_t *puStack_50;
  wchar_t r;
  void *sp;
  void *compressed_buff;
  ssize_t bytes_avail;
  zip *zip;
  int64_t *offset_local;
  size_t *size_local;
  void **buff_local;
  archive_read *a_local;
  
  bytes_avail = (ssize_t)a->format->data;
  zip = (zip *)offset;
  offset_local = (int64_t *)size;
  size_local = (size_t *)buff;
  buff_local = (void **)a;
  if (*(long *)(bytes_avail + 0xa8) == 0) {
    *(undefined8 *)(bytes_avail + 0xb0) = 0x40000;
    pvVar2 = malloc(*(size_t *)(bytes_avail + 0xb0));
    *(void **)(bytes_avail + 0xa8) = pvVar2;
    if (*(long *)(bytes_avail + 0xa8) == 0) {
      archive_set_error((archive *)buff_local,0xc,"No memory for ZIP decompression");
      return L'\xffffffe2';
    }
  }
  buff_remaining._4_4_ = zip_deflate_init((archive_read *)buff_local,(zip *)bytes_avail);
  a_local._4_4_ = buff_remaining._4_4_;
  if (buff_remaining._4_4_ == L'\0') {
    puStack_50 = (uint8_t *)
                 __archive_read_ahead((archive_read *)buff_local,1,(ssize_t *)&compressed_buff);
    if (((*(ushort *)(*(long *)(bytes_avail + 0x70) + 0x7e) & 8) == 0) &&
       (*(long *)(bytes_avail + 0x78) < (long)compressed_buff)) {
      compressed_buff = *(void **)(bytes_avail + 0x78);
    }
    sp = puStack_50;
    if ((long)compressed_buff < 0) {
      archive_set_error((archive *)buff_local,0x54,"Truncated ZIP file body");
      a_local._4_4_ = L'\xffffffe2';
    }
    else {
      if ((*(char *)(bytes_avail + 0x1f84) != '\0') || (*(char *)(bytes_avail + 0x1fe0) != '\0')) {
        if (*(void **)(bytes_avail + 0x1f68) < compressed_buff) {
          dsize = (*(long *)(bytes_avail + 0x1f50) + *(long *)(bytes_avail + 0x1f60)) -
                  (*(long *)(bytes_avail + 0x1f58) + *(long *)(bytes_avail + 0x1f68));
          if (compressed_buff < dsize) {
            dsize = (size_t)compressed_buff;
          }
          if ((((*(ushort *)(*(long *)(bytes_avail + 0x70) + 0x7e) & 8) == 0) &&
              (0 < *(long *)(bytes_avail + 0x78))) &&
             (*(long *)(bytes_avail + 0x78) < (long)(*(long *)(bytes_avail + 0x1f68) + dsize))) {
            if (*(long *)(bytes_avail + 0x78) < *(long *)(bytes_avail + 0x1f68)) {
              dsize = 0;
            }
            else {
              dsize = *(long *)(bytes_avail + 0x78) - *(long *)(bytes_avail + 0x1f68);
            }
          }
          if (dsize != 0) {
            if (*(char *)(bytes_avail + 0x1f84) == '\0') {
              local_68 = dsize;
              aes_ctr_update((archive_crypto_ctx *)(bytes_avail + 0x1f88),puStack_50,dsize,
                             (uint8_t *)
                             (*(long *)(bytes_avail + 0x1f58) + *(long *)(bytes_avail + 0x1f68)),
                             &local_68);
            }
            else {
              trad_enc_decrypt_update
                        ((trad_enc_ctx *)(bytes_avail + 0x1f78),puStack_50,dsize,
                         (uint8_t *)
                         (*(long *)(bytes_avail + 0x1f58) + *(long *)(bytes_avail + 0x1f68)),dsize);
            }
            *(size_t *)(bytes_avail + 0x1f68) = dsize + *(long *)(bytes_avail + 0x1f68);
          }
        }
        compressed_buff = *(void **)(bytes_avail + 0x1f68);
        sp = *(void **)(bytes_avail + 0x1f58);
      }
      *(void **)(bytes_avail + 0xb8) = sp;
      *(undefined4 *)(bytes_avail + 0xc0) = compressed_buff._0_4_;
      *(undefined8 *)(bytes_avail + 200) = 0;
      *(undefined8 *)(bytes_avail + 0xd0) = *(undefined8 *)(bytes_avail + 0xa8);
      *(undefined4 *)(bytes_avail + 0xd8) = *(undefined4 *)(bytes_avail + 0xb0);
      *(undefined8 *)(bytes_avail + 0xe0) = 0;
      buff_remaining._4_4_ = cm_zlib_inflate((z_streamp)(bytes_avail + 0xb8),0);
      if (buff_remaining._4_4_ == 0xfffffffc) {
        archive_set_error((archive *)buff_local,0xc,"Out of memory for ZIP decompression");
        a_local._4_4_ = L'\xffffffe2';
      }
      else {
        if (buff_remaining._4_4_ != 0) {
          if (buff_remaining._4_4_ != 1) {
            archive_set_error((archive *)buff_local,-1,"ZIP decompression failed (%d)",
                              (ulong)(uint)buff_remaining._4_4_);
            return L'\xffffffe2';
          }
          *(undefined1 *)(bytes_avail + 0xa2) = 1;
        }
        compressed_buff = *(void **)(bytes_avail + 200);
        if ((*(char *)(bytes_avail + 0x1f84) != '\0') || (*(char *)(bytes_avail + 0x1fe0) != '\0'))
        {
          *(long *)(bytes_avail + 0x1f68) = *(long *)(bytes_avail + 0x1f68) - (long)compressed_buff;
          if (*(long *)(bytes_avail + 0x1f68) == 0) {
            *(undefined8 *)(bytes_avail + 0x1f58) = *(undefined8 *)(bytes_avail + 0x1f50);
          }
          else {
            *(long *)(bytes_avail + 0x1f58) =
                 (long)compressed_buff + *(long *)(bytes_avail + 0x1f58);
          }
        }
        if (*(char *)(bytes_avail + 0x1ff0) != '\0') {
          __hmac_sha1_update((archive_hmac_sha1_ctx *)(bytes_avail + 0x1fe8),puStack_50,
                             (size_t)compressed_buff);
        }
        __archive_read_consume((archive_read *)buff_local,(int64_t)compressed_buff);
        *(long *)(bytes_avail + 0x78) = *(long *)(bytes_avail + 0x78) - (long)compressed_buff;
        *(long *)(bytes_avail + 0x80) = (long)compressed_buff + *(long *)(bytes_avail + 0x80);
        *offset_local = *(int64_t *)(bytes_avail + 0xe0);
        *(long *)(bytes_avail + 0x88) =
             *(long *)(bytes_avail + 0xe0) + *(long *)(bytes_avail + 0x88);
        *size_local = *(size_t *)(bytes_avail + 0xa8);
        if ((*(char *)(bytes_avail + 0xa2) != '\0') && (*(char *)(bytes_avail + 0x1ff0) != '\0')) {
          wVar1 = check_authentication_code((archive_read *)buff_local,(void *)0x0);
          if (wVar1 != L'\0') {
            return wVar1;
          }
          buff_remaining._4_4_ = 0;
        }
        a_local._4_4_ = consume_optional_marker((archive_read *)buff_local,(zip *)bytes_avail);
        if (a_local._4_4_ == L'\0') {
          a_local._4_4_ = L'\0';
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
zip_read_data_deflate(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip;
	ssize_t bytes_avail;
	const void *compressed_buff, *sp;
	int r;

	(void)offset; /* UNUSED */

	zip = (struct zip *)(a->format->data);

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = 256 * 1024;
		zip->uncompressed_buffer
		    = (unsigned char *)malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for ZIP decompression");
			return (ARCHIVE_FATAL);
		}
	}

	r = zip_deflate_init(a, zip);
	if (r != ARCHIVE_OK)
		return (r);

	/*
	 * Note: '1' here is a performance optimization.
	 * Recall that the decompression layer returns a count of
	 * available bytes; asking for more than that forces the
	 * decompressor to combine reads by copying data.
	 */
	compressed_buff = sp = __archive_read_ahead(a, 1, &bytes_avail);
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    && bytes_avail > zip->entry_bytes_remaining) {
		bytes_avail = (ssize_t)zip->entry_bytes_remaining;
	}
	if (bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file body");
		return (ARCHIVE_FATAL);
	}

	if (zip->tctx_valid || zip->cctx_valid) {
		if (zip->decrypted_bytes_remaining < (size_t)bytes_avail) {
			size_t buff_remaining =
			    (zip->decrypted_buffer +
			    zip->decrypted_buffer_size)
			    - (zip->decrypted_ptr +
			    zip->decrypted_bytes_remaining);

			if (buff_remaining > (size_t)bytes_avail)
				buff_remaining = (size_t)bytes_avail;

			if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END) &&
			      zip->entry_bytes_remaining > 0) {
				if ((int64_t)(zip->decrypted_bytes_remaining
				    + buff_remaining)
				      > zip->entry_bytes_remaining) {
					if (zip->entry_bytes_remaining <
					    (int64_t)zip->decrypted_bytes_remaining)
						buff_remaining = 0;
					else
						buff_remaining =
						    (size_t)zip->entry_bytes_remaining
						    - zip->decrypted_bytes_remaining;
				}
			}
			if (buff_remaining > 0) {
				if (zip->tctx_valid) {
					trad_enc_decrypt_update(&zip->tctx,
					    compressed_buff, buff_remaining,
					    zip->decrypted_ptr
					      + zip->decrypted_bytes_remaining,
					    buff_remaining);
				} else {
					size_t dsize = buff_remaining;
					archive_decrypto_aes_ctr_update(
					    &zip->cctx,
					    compressed_buff, buff_remaining,
					    zip->decrypted_ptr
					      + zip->decrypted_bytes_remaining,
					    &dsize);
				}
				zip->decrypted_bytes_remaining +=
				    buff_remaining;
			}
		}
		bytes_avail = zip->decrypted_bytes_remaining;
		compressed_buff = (const char *)zip->decrypted_ptr;
	}

	/*
	 * A bug in zlib.h: stream.next_in should be marked 'const'
	 * but isn't (the library never alters data through the
	 * next_in pointer, only reads it).  The result: this ugly
	 * cast to remove 'const'.
	 */
	zip->stream.next_in = (Bytef *)(uintptr_t)(const void *)compressed_buff;
	zip->stream.avail_in = (uInt)bytes_avail;
	zip->stream.total_in = 0;
	zip->stream.next_out = zip->uncompressed_buffer;
	zip->stream.avail_out = (uInt)zip->uncompressed_buffer_size;
	zip->stream.total_out = 0;

	r = inflate(&zip->stream, 0);
	switch (r) {
	case Z_OK:
		break;
	case Z_STREAM_END:
		zip->end_of_entry = 1;
		break;
	case Z_MEM_ERROR:
		archive_set_error(&a->archive, ENOMEM,
		    "Out of memory for ZIP decompression");
		return (ARCHIVE_FATAL);
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "ZIP decompression failed (%d)", r);
		return (ARCHIVE_FATAL);
	}

	/* Consume as much as the compressor actually used. */
	bytes_avail = zip->stream.total_in;
	if (zip->tctx_valid || zip->cctx_valid) {
		zip->decrypted_bytes_remaining -= bytes_avail;
		if (zip->decrypted_bytes_remaining == 0)
			zip->decrypted_ptr = zip->decrypted_buffer;
		else
			zip->decrypted_ptr += bytes_avail;
	}
	/* Calculate compressed data as much as we used.*/
	if (zip->hctx_valid)
		archive_hmac_sha1_update(&zip->hctx, sp, bytes_avail);
	__archive_read_consume(a, bytes_avail);
	zip->entry_bytes_remaining -= bytes_avail;
	zip->entry_compressed_bytes_read += bytes_avail;

	*size = zip->stream.total_out;
	zip->entry_uncompressed_bytes_read += zip->stream.total_out;
	*buff = zip->uncompressed_buffer;

	if (zip->end_of_entry && zip->hctx_valid) {
		r = check_authentication_code(a, NULL);
		if (r != ARCHIVE_OK)
			return (r);
	}

	r = consume_optional_marker(a, zip);
	if (r != ARCHIVE_OK)
		return (r);

	return (ARCHIVE_OK);
}